

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O1

void OPN2_KeyOn(ym3438_t *chip)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = chip->cycles;
  uVar2 = chip->channel;
  chip->eg_kon_latch[uVar1] = chip->mode_kon[uVar1];
  chip->eg_kon_csm[uVar1] = '\0';
  if (((ulong)uVar2 == 2) && (chip->mode_kon_csm != '\0')) {
    chip->eg_kon_latch[uVar1] = '\x01';
    chip->eg_kon_csm[uVar1] = '\x01';
  }
  if (uVar1 == chip->mode_kon_channel) {
    chip->mode_kon[uVar2] = chip->mode_kon_operator[0];
    chip->mode_kon[uVar2 + 0xc] = chip->mode_kon_operator[1];
    chip->mode_kon[uVar2 + 6] = chip->mode_kon_operator[2];
    chip->mode_kon[uVar2 + 0x12] = chip->mode_kon_operator[3];
  }
  return;
}

Assistant:

void OPN2_KeyOn(ym3438_t*chip)
{
    Bit32u slot = chip->cycles;
    Bit32u chan = chip->channel;
    /* Key On */
    chip->eg_kon_latch[slot] = chip->mode_kon[slot];
    chip->eg_kon_csm[slot] = 0;
    if (chip->channel == 2 && chip->mode_kon_csm)
    {
        /* CSM Key On */
        chip->eg_kon_latch[slot] = 1;
        chip->eg_kon_csm[slot] = 1;
    }
    if (chip->cycles == chip->mode_kon_channel)
    {
        /* OP1 */
        chip->mode_kon[chan] = chip->mode_kon_operator[0];
        /* OP2 */
        chip->mode_kon[chan + 12] = chip->mode_kon_operator[1];
        /* OP3 */
        chip->mode_kon[chan + 6] = chip->mode_kon_operator[2];
        /* OP4 */
        chip->mode_kon[chan + 18] = chip->mode_kon_operator[3];
    }
}